

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O0

void __thiscall Patch::delete_root(Patch *this)

{
  Node *root;
  Node *pNVar1;
  uint32_t uVar2;
  Node *right;
  Node *left;
  Node *parent;
  Node *node;
  Patch *this_local;
  
  root = this->root;
  left = (Node *)0x0;
  do {
    if (root->left == (Node *)0x0) {
      if (root->right == (Node *)0x0) {
        if (left == (Node *)0x0) {
          delete_node(this,&this->root);
        }
        else if (left->left == root) {
          delete_node(this,&left->left);
        }
        else {
          delete_node(this,&left->right);
        }
        return;
      }
      pNVar1 = root->right;
      rotate_node_left(this,root->right,root,left);
      left = pNVar1;
    }
    else {
      pNVar1 = root->left;
      rotate_node_right(this,root->left,root,left);
      left = pNVar1;
    }
    uVar2 = Node::old_text_size(root);
    left->old_subtree_text_size = left->old_subtree_text_size - uVar2;
    uVar2 = Node::new_text_size(root);
    left->new_subtree_text_size = left->new_subtree_text_size - uVar2;
  } while( true );
}

Assistant:

void Patch::delete_root() {
  Node *node = root, *parent = nullptr;
  while (true) {
    if (node->left) {
      Node *left = node->left;
      rotate_node_right(node->left, node, parent);
      parent = left;
    } else if (node->right) {
      Node *right = node->right;
      rotate_node_left(node->right, node, parent);
      parent = right;
    } else if (parent) {
      if (parent->left == node) {
        delete_node(&parent->left);
        break;
      } else {
        delete_node(&parent->right);
        break;
      }
    } else {
      delete_node(&root);
      break;
    }

    parent->old_subtree_text_size -= node->old_text_size();
    parent->new_subtree_text_size -= node->new_text_size();
  }
}